

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::PointsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,range<unsigned_long> *r,
          size_t k,uint geomID)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  PrimInfo *pinfo;
  size_t sVar5;
  size_t sVar6;
  undefined4 uVar7;
  long lVar8;
  uint index;
  unsigned_long uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar9 = r->_begin;
  auVar13._8_4_ = 0x7f800000;
  auVar13._0_8_ = 0x7f8000007f800000;
  auVar13._12_4_ = 0x7f800000;
  auVar14 = ZEXT1664(auVar13);
  auVar11._8_4_ = 0xff800000;
  auVar11._0_8_ = 0xff800000ff800000;
  auVar11._12_4_ = 0xff800000;
  auVar12 = ZEXT1664(auVar11);
  sVar5 = 0;
  auVar15._8_4_ = 0xddccb9a2;
  auVar15._0_8_ = 0xddccb9a2ddccb9a2;
  auVar15._12_4_ = 0xddccb9a2;
  auVar16._8_4_ = 0x5dccb9a2;
  auVar16._0_8_ = 0x5dccb9a25dccb9a2;
  auVar16._12_4_ = 0x5dccb9a2;
  auVar17 = ZEXT1664(auVar11);
  auVar18 = ZEXT1664(auVar13);
  while( true ) {
    if (r->_end <= uVar9) break;
    pBVar1 = (this->super_Points).vertices.items;
    sVar6 = k;
    if ((uVar9 & 0xffffffff) < (pBVar1->super_RawBufferView).num) {
      lVar8 = (uVar9 & 0xffffffff) * (pBVar1->super_RawBufferView).stride;
      pcVar2 = (pBVar1->super_RawBufferView).ptr_ofs;
      if (0.0 <= *(float *)(pcVar2 + lVar8 + 0xc)) {
        auVar11 = *(undefined1 (*) [16])(pcVar2 + lVar8);
        auVar13 = vcmpps_avx(auVar11,auVar15,2);
        auVar11 = vcmpps_avx(auVar11,auVar16,5);
        auVar11 = vorps_avx(auVar13,auVar11);
        uVar7 = vmovmskps_avx(auVar11);
        if ((char)uVar7 == '\0') {
          lVar8 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
          lVar10 = *(long *)&(this->super_Points).field_0x68 * uVar9;
          auVar11 = *(undefined1 (*) [16])(lVar8 + lVar10);
          auVar13 = ZEXT416((uint)(*(float *)(lVar8 + 0xc + lVar10) *
                                  (this->super_Points).maxRadiusScale));
          auVar13 = vshufps_avx(auVar13,auVar13,0);
          auVar19 = vsubps_avx(auVar11,auVar13);
          aVar3 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar19,ZEXT416(geomID),0x30);
          auVar19._0_4_ = auVar11._0_4_ + auVar13._0_4_;
          auVar19._4_4_ = auVar11._4_4_ + auVar13._4_4_;
          auVar19._8_4_ = auVar11._8_4_ + auVar13._8_4_;
          auVar19._12_4_ = auVar11._12_4_ + auVar13._12_4_;
          aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar19,ZEXT416((uint)uVar9),0x30);
          auVar11 = vminps_avx((undefined1  [16])auVar18._0_16_,(undefined1  [16])aVar3);
          auVar18 = ZEXT1664(auVar11);
          auVar11 = vmaxps_avx((undefined1  [16])auVar17._0_16_,(undefined1  [16])aVar4);
          auVar17 = ZEXT1664(auVar11);
          auVar20._0_4_ = aVar3.x + aVar4.x;
          auVar20._4_4_ = aVar3.y + aVar4.y;
          auVar20._8_4_ = aVar3.z + aVar4.z;
          auVar20._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
          auVar11 = vminps_avx((undefined1  [16])auVar14._0_16_,auVar20);
          auVar14 = ZEXT1664(auVar11);
          auVar11 = vmaxps_avx((undefined1  [16])auVar12._0_16_,auVar20);
          auVar12 = ZEXT1664(auVar11);
          sVar5 = sVar5 + 1;
          sVar6 = k + 1;
          prims[k].upper.field_0.field_1 = aVar4;
          prims[k].lower.field_0.field_1 = aVar3;
        }
      }
    }
    uVar9 = uVar9 + 1;
    k = sVar6;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       auVar18._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       auVar17._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       auVar14._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       auVar12._0_16_;
  __return_storage_ptr__->end = sVar5;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, &bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }